

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
interfaces::MakeCleanupHandler(function<void_()> *cleanup)

{
  tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> in_RDI;
  long in_FS_OFFSET;
  function<void_()> *unaff_retaddr;
  __uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __u;
  unique_ptr<common::(anonymous_namespace)::CleanupHandler,_std::default_delete<common::(anonymous_namespace)::CleanupHandler>_>
  *this;
  unique_ptr<common::(anonymous_namespace)::CleanupHandler,_std::default_delete<common::(anonymous_namespace)::CleanupHandler>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_10;
  __u._M_t.super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
  super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl =
       (tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
       (tuple<interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>)
       in_RDI.
       super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
       super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  std::make_unique<common::(anonymous_namespace)::CleanupHandler,std::function<void()>>
            (unaff_retaddr);
  std::unique_ptr<interfaces::Handler,std::default_delete<interfaces::Handler>>::
  unique_ptr<common::(anonymous_namespace)::CleanupHandler,std::default_delete<common::(anonymous_namespace)::CleanupHandler>,void>
            ((unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> *)this,
             (unique_ptr<common::(anonymous_namespace)::CleanupHandler,_std::default_delete<common::(anonymous_namespace)::CleanupHandler>_>
              *)__u._M_t.
                super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
                .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl);
  std::
  unique_ptr<common::(anonymous_namespace)::CleanupHandler,_std::default_delete<common::(anonymous_namespace)::CleanupHandler>_>
  ::~unique_ptr(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
               .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeCleanupHandler(std::function<void()> cleanup)
{
    return std::make_unique<common::CleanupHandler>(std::move(cleanup));
}